

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boostdep.cpp
# Opt level: O1

void enable_secondary(bool *secondary,bool track_sources,bool track_tests)

{
  _Base_ptr p_Var1;
  module_primary_actions local_98;
  undefined1 *local_90;
  undefined8 local_88;
  undefined1 local_80;
  undefined7 uStack_7f;
  undefined1 *local_70;
  undefined8 local_68;
  undefined1 local_60;
  undefined7 uStack_5f;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  if (*secondary == false) {
    if ((_Rb_tree_header *)s_modules_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_left
        != &s_modules_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
      p_Var1 = s_modules_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        local_98._vptr_module_primary_actions = (_func_int **)&PTR_heading_00121218;
        local_90 = &local_80;
        local_88 = 0;
        local_80 = 0;
        local_70 = &local_60;
        local_68 = 0;
        local_60 = 0;
        local_48 = 0;
        local_40 = 0;
        local_50 = &local_40;
        scan_module_dependencies((string *)(p_Var1 + 1),&local_98,track_sources,track_tests,true);
        local_98._vptr_module_primary_actions = (_func_int **)&PTR_heading_00121218;
        if (local_50 != &local_40) {
          operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
        }
        if (local_70 != &local_60) {
          operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
        }
        if (local_90 != &local_80) {
          operator_delete(local_90,CONCAT71(uStack_7f,local_80) + 1);
        }
        p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1);
      } while ((_Rb_tree_header *)p_Var1 != &s_modules_abi_cxx11_._M_t._M_impl.super__Rb_tree_header
              );
    }
    *secondary = true;
  }
  return;
}

Assistant:

static void enable_secondary( bool & secondary, bool track_sources, bool track_tests )
{
    if( !secondary )
    {
        try
        {
            build_module_dependency_map( track_sources, track_tests );
        }
        catch( fs::filesystem_error const & x )
        {
            std::cout << x.what() << std::endl;
        }

        secondary = true;
    }
}